

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O2

void load1(char *filename)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  Am_Value *pAVar4;
  char *pcVar5;
  Am_String aAStack_288 [8];
  Am_String local_280 [8];
  Am_Value_List l3;
  Am_Value local_268;
  Am_Value_List l2;
  Am_Value_List l4;
  Am_Value_List l1;
  Am_Value_List local_228 [16];
  ifstream in_file;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&in_file,filename,_S_in);
  if ((abStack_1f8[*(long *)(_in_file + -0x18)] & 5) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"open failed");
    std::endl<char,std::char_traits<char>>(poVar3);
    goto LAB_00103133;
  }
  Am_Load_Save_Context::Reset();
  Am_Load_Save_Context::Load((istream *)&l2);
  Am_Value_List::Am_Value_List(&l1,(Am_Value *)&l2);
  Am_Value::~Am_Value((Am_Value *)&l2);
  Am_Load_Save_Context::Load((istream *)&l3);
  Am_Value_List::Am_Value_List(&l2,(Am_Value *)&l3);
  Am_Value::~Am_Value((Am_Value *)&l3);
  Am_Load_Save_Context::Load((istream *)&l4);
  Am_Value_List::Am_Value_List(&l3,(Am_Value *)&l4);
  Am_Value::~Am_Value((Am_Value *)&l4);
  Am_Load_Save_Context::Load((istream *)&local_268);
  Am_Value_List::Am_Value_List(&l4,&local_268);
  Am_Value::~Am_Value(&local_268);
  pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&l1);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pcVar5 = "Test 1 failed";
  if (iVar2 == 5) {
    pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&l1);
    Am_String::Am_String(aAStack_288,pAVar4);
    cVar1 = Am_String::operator==(aAStack_288,"hello");
    if (cVar1 != '\0') {
      pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&l1);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      if ((iVar2 == 10) && (cVar1 = Am_Value_List::operator==(&l1,&l2), cVar1 != '\0')) {
        pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&l3);
        iVar2 = Am_Value::operator_cast_to_int(pAVar4);
        if (iVar2 == 5) {
          pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&l3);
          Am_String::Am_String(local_280,pAVar4);
          cVar1 = Am_String::operator==(local_280,"hello");
          if (cVar1 != '\0') {
            pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&l3);
            iVar2 = Am_Value::operator_cast_to_int(pAVar4);
            if (iVar2 == 10) {
              pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&l3);
              Am_Value_List::Am_Value_List((Am_Value_List *)&local_268,pAVar4);
              cVar1 = Am_Value_List::operator==((Am_Value_List *)&local_268,&l1);
              if (cVar1 != '\0') {
                pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)&l3);
                Am_Value_List::Am_Value_List(local_228,pAVar4);
                cVar1 = Am_Value_List::operator==(local_228,&l2);
                if (cVar1 != '\0') {
                  cVar1 = Am_Value_List::operator==(&l4,(Am_Value_List *)&Am_No_Value_List);
                  Am_Value_List::~Am_Value_List(local_228);
                  Am_Value_List::~Am_Value_List((Am_Value_List *)&local_268);
                  Am_String::~Am_String(local_280);
                  Am_String::~Am_String(aAStack_288);
                  pcVar5 = "Test 1 failed";
                  if (cVar1 != '\0') {
                    pcVar5 = "Test 1 okay";
                  }
                  goto LAB_001030f4;
                }
                Am_Value_List::~Am_Value_List(local_228);
              }
              Am_Value_List::~Am_Value_List((Am_Value_List *)&local_268);
            }
          }
          Am_String::~Am_String(local_280);
        }
      }
    }
    Am_String::~Am_String(aAStack_288);
  }
LAB_001030f4:
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  Am_Value_List::~Am_Value_List(&l4);
  Am_Value_List::~Am_Value_List(&l3);
  Am_Value_List::~Am_Value_List(&l2);
  Am_Value_List::~Am_Value_List(&l1);
LAB_00103133:
  std::ifstream::~ifstream(&in_file);
  return;
}

Assistant:

void
load1(const char *filename)
{
  // open input-file
  std::ifstream in_file(filename, std::ios::in);
  if (!in_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  // reset internal reference counters etc. (should always be done for new stream)
  Am_Default_Load_Save_Context.Reset();

  // read-in the different Am_Value_List objects
  Am_Value_List l1 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l2 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l3 = Am_Default_Load_Save_Context.Load(in_file);
  Am_Value_List l4 = Am_Default_Load_Save_Context.Load(in_file);

  if ((int)l1.Get_Nth(0) == 5 && Am_String(l1.Get_Nth(1)) == "hello" &&
      (int)l1.Get_Nth(2) == 10 && l1 == l2 && (int)l3.Get_Nth(0) == 5 &&
      Am_String(l3.Get_Nth(1)) == "hello" && (int)l3.Get_Nth(2) == 10 &&
      Am_Value_List(l3.Get_Nth(3)) == l1 &&
      Am_Value_List(l3.Get_Nth(4)) == l2 && l4 == Am_No_Value_List) {
    std::cout << "Test 1 okay" << std::endl;
  } else {
    std::cout << "Test 1 failed" << std::endl;
  }

  return;
}